

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 pDstBuf [8];
  int width;
  int height;
  undefined8 pImage_data;
  ostream *poVar1;
  char local_4c8 [8];
  ofstream image2;
  params local_2c4;
  undefined1 local_2b8 [8];
  ImgClass jpge;
  uchar *imgData;
  char *pcStack_270;
  int actual_comps;
  char *jpgFile;
  ofstream JPG_file;
  undefined1 local_68 [8];
  ImgClass img;
  Webcam local_19;
  char **ppcStack_18;
  Webcam usbcam;
  char **argv_local;
  int argc_local;
  
  ppcStack_18 = argv;
  Webcam::Webcam(&local_19,"/dev/video0",0xcc0,0x990);
  if ((local_19.isOpen & 1U) != 0) {
    Webcam::start(&local_19);
    sleep(10);
    Webcam::getImg((ImgClass *)local_68,&local_19);
    Webcam::stop(&local_19);
    poVar1 = std::operator<<((ostream *)&std::cout,"getImg:");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"img.width:  ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)img.data);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"img.height: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,img.data._4_4_);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"img.size:   ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,img.width);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ofstream::ofstream(&jpgFile);
    pcStack_270 = "1.jpg";
    std::ofstream::open(&jpgFile,"1.jpg",0x10);
    std::ostream::write((char *)&jpgFile,(long)local_68);
    std::ofstream::close();
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_bf6d);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    jpge._48_8_ = jpgd::decompress_jpeg_image_from_memory
                            ((uchar *)local_68,img.width,(int *)&img,(int *)((long)&img.data + 4),
                             (int *)((long)&imgData + 4),3);
    poVar1 = std::operator<<((ostream *)&std::cout,"actual_comps:");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,imgData._4_4_);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_bf99);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"width  = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)img.data);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"height = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,img.data._4_4_);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"size   = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,img.width);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    ImgClass::ImgClass((ImgClass *)local_2b8,(int)img.data,img.data._4_4_,img.width);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_bfcd);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    pImage_data = jpge._48_8_;
    height = jpge.data._4_4_;
    width = (int)jpge.data;
    pDstBuf = local_2b8;
    ::jpge::params::params(&local_2c4);
    ::jpge::compress_image_to_jpeg_file_in_memory
              ((void *)pDstBuf,&jpge.width,width,height,imgData._4_4_,(uint8 *)pImage_data,
               &local_2c4);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_bfd7);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"width  = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)jpge.data);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"height = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,jpge.data._4_4_);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"size   = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,jpge.width);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ofstream::ofstream(local_4c8);
    std::ofstream::open(local_4c8,"2.jpg",0x10);
    std::ostream::write(local_4c8,(long)local_2b8);
    std::ofstream::close();
    free((void *)jpge._48_8_);
    poVar1 = std::operator<<((ostream *)&std::cout,"end");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ofstream::~ofstream(local_4c8);
    ImgClass::~ImgClass((ImgClass *)local_2b8);
    std::ofstream::~ofstream(&jpgFile);
    ImgClass::~ImgClass((ImgClass *)local_68);
  }
  Webcam::~Webcam(&local_19);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    Webcam usbcam("/dev/video0", 3264, 2448);
    if(!usbcam.isOpen) {
        return 0;
    }

    //测试单帧拍摄模式
    //ImgClass img = usbcam.snap();

    //测试流模式
    usbcam.start();     //开启后台线程处理
    sleep(10);          //后台线程运行10s(用于测试帧率)
    ImgClass img = usbcam.getImg(); //获取流中最新的jpg图片
    usbcam.stop();      //关闭并停止拍摄线程

    cout<<"getImg:"<<endl;
    cout<<"img.width:  "<<img.width<<endl;
    cout<<"img.height: "<<img.height<<endl;
    cout<<"img.size:   "<<img.size<<endl;

    //原图保存到文件"1.jpg"
    ofstream JPG_file;
    const char *jpgFile = "1.jpg";
    JPG_file.open(jpgFile);
    JPG_file.write((char *)img.data, img.size);
    JPG_file.close();

    //jpg解码 img.data -->> imgData;
    int actual_comps;   //通道数
    cout<<"开始解码..."<<endl;
    unsigned char *imgData = decompress_jpeg_image_from_memory(img.data, img.size, &img.width, &img.height, &actual_comps, 3);
    cout<<"actual_comps:"<<actual_comps<<endl;
    cout<<"解码结束！"<<endl;
    cout<<"width  = "<<img.width<<endl;
    cout<<"height = "<<img.height<<endl;
    cout<<"size   = "<<img.size<<endl;

    //jpg压缩编码
    ImgClass jpge(img.width, img.height, img.size); //初始化图像信息 for compress_image_to_jpeg_file_in_memory()
    cout<<"开始编码..."<<endl;
    compress_image_to_jpeg_file_in_memory(jpge.data, jpge.size, jpge.width, jpge.height, actual_comps, imgData);
    cout<<"编码结束!"<<endl;
    cout<<"width  = "<<jpge.width<<endl;
    cout<<"height = "<<jpge.height<<endl;
    cout<<"size   = "<<jpge.size<<endl;

    //重新压缩后图像保存到文件"2.jpg"
    ofstream image2;
    image2.open("2.jpg");
    image2.write((char *)jpge.data, jpge.size);
    image2.close();

    free(imgData);

    cout<<"end"<<endl;
    return 0;
}